

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF32
          (BinaryWriterSpec *this,uint32_t f32_bits,ExpectedNan expected)

{
  if (expected == Arithmetic) {
    WriteString(this,"nan:arithmetic");
    return;
  }
  if (expected != Canonical) {
    if (expected == None) {
      Stream::Writef(this->json_stream_,"\"%u\"",f32_bits);
      return;
    }
    return;
  }
  WriteString(this,"nan:canonical");
  return;
}

Assistant:

void BinaryWriterSpec::WriteF32(uint32_t f32_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%u\"", f32_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}